

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.cpp
# Opt level: O1

void __thiscall TPZPostProcMat::TPZPostProcMat(TPZPostProcMat *this)

{
  long lVar1;
  char *pcVar2;
  
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial.fId = 0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
           ).super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_functor + 8) = 0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.fForcingFunction._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.fForcingFunctionPOrder = 0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace = (TPZMatSingleSpace)0x0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatInterfaceSingleSpace<double> = (TPZMatInterfaceSingleSpace<double>)0x0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial = 0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = 0.0;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::TPZMatBase
            (&this->
              super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
             ,&PTR_PTR_019a5c90);
  *(undefined ***)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial = &PTR__TPZPostProcMat_019a59b0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZPostProcMat_019a5b20;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatInterfaceSingleSpace<double> =
       (TPZMatInterfaceSingleSpace<double>)&PTR__TPZPostProcMat_019a5c10;
  (this->fVars).super_TPZVec<TPZPostProcVar>.fStore = (TPZPostProcVar *)0x0;
  (this->fVars).super_TPZVec<TPZPostProcVar>.fNElements = 0;
  (this->fVars).super_TPZVec<TPZPostProcVar>.fNAlloc = 0;
  (this->fVars).super_TPZVec<TPZPostProcVar>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019a68b8;
  lVar1 = 0;
  do {
    pcVar2 = (this->fVars).fExtAlloc[0].fName.field_2._M_local_buf + lVar1;
    *(undefined ***)((long)&(this->fVars).fExtAlloc[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZPostProcVar_019a5d38;
    *(undefined8 *)((long)&(this->fVars).fExtAlloc[0].fIndex + lVar1) = 0xffffffffffffffff;
    *(char **)((long)&(this->fVars).fExtAlloc[0].fName._M_dataplus._M_p + lVar1) = pcVar2;
    *(undefined8 *)((long)&(this->fVars).fExtAlloc[0].fName._M_string_length + lVar1) = 0;
    *pcVar2 = '\0';
    *(undefined8 *)((long)&(this->fVars).fExtAlloc[0].fNumEq + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0x460);
  (this->fVars).super_TPZVec<TPZPostProcVar>.fStore = (this->fVars).fExtAlloc;
  (this->fVars).super_TPZVec<TPZPostProcVar>.fNElements = 0;
  (this->fVars).super_TPZVec<TPZPostProcVar>.fNAlloc = 0;
  TPZManVector<TPZPostProcVar,_20>::Resize(&this->fVars,0);
  this->fDimension = -1;
  return;
}

Assistant:

TPZPostProcMat::TPZPostProcMat() :TPZRegisterClassId(&TPZPostProcMat::ClassId),TBase()
{
	fVars.Resize(0);	
	fDimension = -1;
}